

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O2

int __thiscall CMasterServer::Save(CMasterServer *this)

{
  long lVar1;
  IStorage *pIVar2;
  int iVar3;
  uint size;
  undefined4 extraout_var;
  NETADDR *addr;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  char aBuf [256];
  char aAddrStr [48];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = this->m_pStorage;
  iVar4 = -1;
  if (pIVar2 != (IStorage *)0x0) {
    iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,"masters.cfg",2,0,0,0,0,0);
    io = (IOHANDLE)CONCAT44(extraout_var,iVar3);
    if (io != (IOHANDLE)0x0) {
      addr = &this->m_aMasterServers[0].m_Addr;
      lVar5 = 4;
      while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
        if (addr->type == 0) {
          aAddrStr[0] = '\0';
        }
        else {
          net_addr_str(addr,aAddrStr,0x30,1);
        }
        str_format(aBuf,0x100,"%s %s",addr[-6].ip + 0xc,aAddrStr);
        size = str_length(aBuf);
        io_write(io,aBuf,size);
        io_write_newline(io);
        addr = addr + 0xf;
      }
      io_close(io);
      iVar4 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

virtual int Save()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_WRITE, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		for(int i = 0; i < MAX_MASTERSERVERS; i++)
		{
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(m_aMasterServers[i].m_Addr.type != NETTYPE_INVALID)
				net_addr_str(&m_aMasterServers[i].m_Addr, aAddrStr, sizeof(aAddrStr), true);
			else
				aAddrStr[0] = 0;
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "%s %s", m_aMasterServers[i].m_aHostname, aAddrStr);
			io_write(File, aBuf, str_length(aBuf));
			io_write_newline(File);
		}

		io_close(File);
		return 0;
	}